

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O1

void __thiscall Moc::parsePluginData(Moc *this,ClassDef *def)

{
  char *pcVar1;
  Symbol *pSVar2;
  QArrayData *pQVar3;
  char (*pacVar4) [22];
  bool bVar5;
  char cVar6;
  long lVar7;
  QJsonParseError QVar8;
  reference pQVar9;
  int iVar10;
  QTypedArrayData<char> *__old_val;
  undefined8 *puVar11;
  storage_type *psVar12;
  Data *pDVar13;
  IncludePath *p;
  IncludePath *pIVar14;
  IncludePath *pIVar15;
  long in_FS_OFFSET;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QFileInfo fi;
  QString local_1a0;
  QByteArray local_188;
  QByteArray local_170;
  QStringBuilder<const_char_(&)[22],_QByteArray> local_158;
  QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[23]> local_138;
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[23]>,_QByteArray>
  local_108;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  QByteArray local_b8;
  QJsonParseError local_a0;
  QJsonParseError local_98;
  undefined8 *puStack_90;
  storage_type *local_88;
  QByteArray local_78;
  QJsonParseError local_58;
  QArrayData *pQStack_50;
  Data *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar7 = (this->super_Parser).index;
  if ((lVar7 < (this->super_Parser).symbols.d.size) &&
     ((this->super_Parser).symbols.d.ptr[lVar7].token == LPAREN)) {
    lVar7 = lVar7 + 1;
    (this->super_Parser).index = lVar7;
    local_58.offset = 0;
    local_58.error = NoError;
    pQStack_50 = (QArrayData *)0x0;
    local_48 = (Data *)0x0;
    if (lVar7 < (this->super_Parser).symbols.d.size) {
      do {
        if ((this->super_Parser).symbols.d.ptr[lVar7].token != IDENTIFIER) break;
        (this->super_Parser).index = lVar7 + 1;
        local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray::mid((longlong)&local_78,(longlong)&(this->super_Parser).symbols.d.ptr[lVar7].lex
                       );
        local_108.a.a.a = (char (*) [22])0x142b9e;
        bVar5 = operator==(&local_78,(char **)&local_108);
        if (bVar5) {
          lVar7 = (this->super_Parser).index;
          if (((this->super_Parser).symbols.d.size <= lVar7) ||
             (pSVar2 = (this->super_Parser).symbols.d.ptr, pSVar2[lVar7].token != PP_STRING_LITERAL)
             ) goto LAB_0011cf6a;
          (this->super_Parser).index = lVar7 + 1;
          QByteArray::mid((longlong)&local_108,(longlong)&pSVar2[lVar7].lex);
          QVar8 = (QJsonParseError)(def->pluginData).iid.d.d;
          pQVar3 = (QArrayData *)(def->pluginData).iid.d.ptr;
          (def->pluginData).iid.d.d = (Data *)local_108.a.a.a;
          (def->pluginData).iid.d.ptr = (char *)local_108.a.a.b.d.d;
          pDVar13 = (Data *)(def->pluginData).iid.d.size;
          (def->pluginData).iid.d.size = (qsizetype)local_108.a.a.b.d.ptr;
          local_108.a.a.b.d.d = (Data *)pQVar3;
LAB_0011c81c:
          local_108.a.a.a = (char (*) [22])QVar8;
          local_108.a.a.b.d.ptr = (char *)pDVar13;
          if (QVar8 != (QJsonParseError)0x0) {
            LOCK();
            *(int *)QVar8 = *(int *)QVar8 + -1;
            UNLOCK();
            if (*(int *)QVar8 == 0) {
LAB_0011c83e:
              QArrayData::deallocate((QArrayData *)QVar8,1,0x10);
            }
          }
        }
        else {
          local_108.a.a.a = (char (*) [22])0x142ba2;
          bVar5 = operator==(&local_78,(char **)&local_108);
          if (bVar5) {
            lVar7 = (this->super_Parser).index;
            if ((lVar7 < (this->super_Parser).symbols.d.size) &&
               (pSVar2 = (this->super_Parser).symbols.d.ptr,
               pSVar2[lVar7].token == PP_STRING_LITERAL)) {
              (this->super_Parser).index = lVar7 + 1;
              QByteArray::mid((longlong)&local_108,(longlong)&pSVar2[lVar7].lex);
              QVar8 = (QJsonParseError)(def->pluginData).uri.d.d;
              pQVar3 = (QArrayData *)(def->pluginData).uri.d.ptr;
              (def->pluginData).uri.d.d = (Data *)local_108.a.a.a;
              (def->pluginData).uri.d.ptr = (char *)local_108.a.a.b.d.d;
              pDVar13 = (Data *)(def->pluginData).uri.d.size;
              (def->pluginData).uri.d.size = (qsizetype)local_108.a.a.b.d.ptr;
              local_108.a.a.b.d.d = (Data *)pQVar3;
              goto LAB_0011c81c;
            }
            goto LAB_0011cf6a;
          }
          local_108.a.a.a = (char (*) [22])anon_var_dwarf_739a1;
          bVar5 = operator==(&local_78,(char **)&local_108);
          if (!bVar5) goto LAB_0011ccc5;
          lVar7 = (this->super_Parser).index;
          if (((this->super_Parser).symbols.d.size <= lVar7) ||
             (pSVar2 = (this->super_Parser).symbols.d.ptr, pSVar2[lVar7].token != PP_STRING_LITERAL)
             ) goto LAB_0011cf6a;
          (this->super_Parser).index = lVar7 + 1;
          local_88 = &DAT_aaaaaaaaaaaaaaaa;
          local_98 = (QJsonParseError)&DAT_aaaaaaaaaaaaaaaa;
          puStack_90 = (undefined8 *)&DAT_aaaaaaaaaaaaaaaa;
          QByteArray::mid((longlong)&local_98,(longlong)&pSVar2[lVar7].lex);
          local_a0 = (QJsonParseError)&DAT_aaaaaaaaaaaaaaaa;
          pQVar9 = std::stack<QByteArray,_QList<QByteArray>_>::top
                             (&(this->super_Parser).currentFilenames);
          QVar16.m_data = (storage_type *)(pQVar9->d).size;
          QVar16.m_size = (qsizetype)&local_108;
          QString::fromLocal8Bit(QVar16);
          QFileInfo::QFileInfo((QFileInfo *)&local_b8,(QString *)&local_108);
          QFileInfo::dir();
          QVar17.m_data = local_88;
          QVar17.m_size = (qsizetype)&local_138;
          QString::fromLocal8Bit(QVar17);
          QFileInfo::QFileInfo((QFileInfo *)&local_a0,(QDir *)&local_158,(QString *)&local_138);
          if ((QArrayData *)local_138.a.a != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)*local_138.a.a)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)*local_138.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)*local_138.a.a)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_138.a.a,2,0x10);
            }
          }
          QDir::~QDir((QDir *)&local_158);
          QFileInfo::~QFileInfo((QFileInfo *)&local_b8);
          if ((QJsonParseError)local_108.a.a.a != (QJsonParseError)0x0) {
            LOCK();
            *(int *)local_108.a.a.a = *(int *)local_108.a.a.a + -1;
            UNLOCK();
            if (*(int *)local_108.a.a.a == 0) {
              QArrayData::deallocate((QArrayData *)local_108.a.a.a,2,0x10);
            }
          }
          lVar7 = (this->super_Parser).includes.d.size;
          if (lVar7 != 0) {
            pIVar14 = (this->super_Parser).includes.d.ptr;
            pIVar15 = pIVar14 + lVar7 * 0x20;
            do {
              cVar6 = QFileInfo::exists();
              iVar10 = 4;
              if ((cVar6 == '\0') && (iVar10 = 5, pIVar14[0x18] == (IncludePath)0x0)) {
                puVar11 = *(undefined8 **)(pIVar14 + 8);
                if (puVar11 == (undefined8 *)0x0) {
                  puVar11 = &QByteArray::_empty;
                }
                psVar12 = (storage_type *)0xffffffffffffffff;
                do {
                  pcVar1 = psVar12 + (long)puVar11 + 1;
                  psVar12 = psVar12 + 1;
                } while (*pcVar1 != '\0');
                QVar18.m_data = psVar12;
                QVar18.m_size = (qsizetype)&local_108;
                QString::fromLocal8Bit(QVar18);
                QDir::QDir((QDir *)&local_158,(QString *)&local_108);
                puVar11 = puStack_90;
                if (puStack_90 == (undefined8 *)0x0) {
                  puVar11 = &QByteArray::_empty;
                }
                psVar12 = (storage_type *)0xffffffffffffffff;
                do {
                  pcVar1 = psVar12 + (long)puVar11 + 1;
                  psVar12 = psVar12 + 1;
                } while (*pcVar1 != '\0');
                QVar19.m_data = psVar12;
                QVar19.m_size = (qsizetype)&local_138;
                QString::fromLocal8Bit(QVar19);
                QFileInfo::setFile((QDir *)&local_a0,(QString *)&local_158);
                if ((QArrayData *)local_138.a.a != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)*local_138.a.a)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)*local_138.a.a)->_q_value).super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)*local_138.a.a)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_138.a.a,2,0x10);
                  }
                }
                QDir::~QDir((QDir *)&local_158);
                if ((QJsonParseError)local_108.a.a.a != (QJsonParseError)0x0) {
                  LOCK();
                  *(int *)local_108.a.a.a = *(int *)local_108.a.a.a + -1;
                  UNLOCK();
                  if (*(int *)local_108.a.a.a == 0) {
                    QArrayData::deallocate((QArrayData *)local_108.a.a.a,2,0x10);
                  }
                }
                cVar6 = QFileInfo::isDir();
                iVar10 = 0;
                if (cVar6 != '\0') {
                  QFileInfo::QFileInfo((QFileInfo *)&local_108);
                  QVar8 = local_a0;
                  local_a0 = (QJsonParseError)local_108.a.a.a;
                  local_108.a.a.a = (char (*) [22])QVar8;
                  QFileInfo::~QFileInfo((QFileInfo *)&local_108);
                  iVar10 = 5;
                }
              }
            } while (((iVar10 == 5) || (iVar10 == 0)) &&
                    (pIVar14 = pIVar14 + 0x20, pIVar14 != pIVar15));
          }
          cVar6 = QFileInfo::exists();
          if (cVar6 == '\0') {
            local_158.b.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
            local_158.a = (char (*) [22])&DAT_aaaaaaaaaaaaaaaa;
            local_158.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            Parser::lexem(&local_b8,&this->super_Parser);
            local_108.a.a.b.d.size = local_b8.d.size;
            local_108.a.a.b.d.ptr = local_b8.d.ptr;
            local_108.a.a.b.d.d = local_b8.d.d;
            local_138.a.a = (char (*) [22])0x142bab;
            local_b8.d.d = (Data *)0x0;
            local_b8.d.ptr = (char *)0x0;
            local_b8.d.size = 0;
            local_108.a.a.a = (char (*) [22])0x142bab;
            local_138.a.b.d.d = (Data *)0x0;
            local_138.a.b.d.ptr = (char *)0x0;
            local_138.a.b.d.size = 0;
            local_108.a.b = (char (*) [23])0x142bc1;
            QStringBuilder::operator_cast_to_QByteArray
                      ((ConvertTo *)&local_158,(QStringBuilder *)&local_108);
            QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[45]>::
            ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[45]>
                             *)&local_108);
            QStringBuilder<const_char_(&)[22],_QByteArray>::~QStringBuilder(&local_138.a);
            QByteArray::~QByteArray(&local_b8);
            pDVar13 = local_158.b.d.d;
LAB_0011d158:
            if (pDVar13 == (Data *)0x0) {
              pDVar13 = (Data *)&QByteArray::_empty;
            }
            Parser::error(&this->super_Parser,(char *)pDVar13);
          }
          local_c8 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
          QFileInfo::canonicalFilePath();
          QFile::QFile((QFile *)&local_c8,(QString *)&local_108);
          if ((QJsonParseError)local_108.a.a.a != (QJsonParseError)0x0) {
            LOCK();
            *(int *)local_108.a.a.a = *(int *)local_108.a.a.a + -1;
            UNLOCK();
            if (*(int *)local_108.a.a.a == 0) {
              QArrayData::deallocate((QArrayData *)local_108.a.a.a,2,0x10);
            }
          }
          cVar6 = QFile::open(&local_c8,1);
          if (cVar6 == '\0') {
            local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_b8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
            Parser::lexem(&local_170,&this->super_Parser);
            local_138.a.b.d.size = local_170.d.size;
            local_138.a.b.d.ptr = local_170.d.ptr;
            local_138.a.b.d.d = local_170.d.d;
            local_158.a = (char (*) [22])0x142bab;
            local_170.d.d = (Data *)0x0;
            local_170.d.ptr = (char *)0x0;
            local_170.d.size = 0;
            local_138.a.a = (char (*) [22])0x142bab;
            local_158.b.d.d = (Data *)0x0;
            local_158.b.d.ptr = (char *)0x0;
            local_158.b.d.size = 0;
            local_138.b = (char (*) [23])0x142bee;
            QIODevice::errorString();
            QString::toUtf8(&local_188,&local_1a0);
            local_108.a.a.b.d.size = local_138.a.b.d.size;
            local_108.a.a.b.d.ptr = local_138.a.b.d.ptr;
            local_108.a.a.b.d.d = local_138.a.b.d.d;
            local_108.b.d.size = local_188.d.size;
            local_108.b.d.ptr = local_188.d.ptr;
            local_108.b.d.d = local_188.d.d;
            local_138.a.b.d.d = (Data *)0x0;
            local_138.a.b.d.ptr = (char *)0x0;
            local_108.a.a.a = local_138.a.a;
            local_138.a.b.d.size = 0;
            local_108.a.b = local_138.b;
            local_188.d.d = (Data *)0x0;
            local_188.d.ptr = (char *)0x0;
            local_188.d.size = 0;
            QStringBuilder::operator_cast_to_QByteArray(&local_b8,(QStringBuilder *)&local_108);
            QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[23]>,_QByteArray>
            ::~QStringBuilder(&local_108);
            QByteArray::~QByteArray(&local_188);
            QString::~QString(&local_1a0);
            QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[23]>::
            ~QStringBuilder(&local_138);
            QStringBuilder<const_char_(&)[22],_QByteArray>::~QStringBuilder(&local_158);
            QByteArray::~QByteArray(&local_170);
            pDVar13 = (Data *)local_b8.d.ptr;
            goto LAB_0011d158;
          }
          QFileInfo::canonicalFilePath();
          QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                    ((QMovableArrayOps<QString> *)&this->parsedPluginMetadataFiles,
                     (this->parsedPluginMetadataFiles).d.size,(QString *)&local_108);
          QList<QString>::end(&this->parsedPluginMetadataFiles);
          if ((QJsonParseError)local_108.a.a.a != (QJsonParseError)0x0) {
            LOCK();
            *(int *)local_108.a.a.a = *(int *)local_108.a.a.a + -1;
            UNLOCK();
            if (*(int *)local_108.a.a.a == 0) {
              QArrayData::deallocate((QArrayData *)local_108.a.a.a,2,0x10);
            }
          }
          QIODevice::readAll();
          pQVar3 = pQStack_50;
          QVar8 = local_58;
          pcVar1 = local_108.a.a.b.d.ptr;
          pacVar4 = local_108.a.a.a;
          local_108.a.a.a = (char (*) [22])local_58;
          local_58 = (QJsonParseError)pacVar4;
          pQStack_50 = &(local_108.a.a.b.d.d)->super_QArrayData;
          local_108.a.a.b.d.d = (Data *)pQVar3;
          local_108.a.a.b.d.ptr = (char *)local_48;
          local_48 = (Data *)pcVar1;
          if (QVar8 != (QJsonParseError)0x0) {
            LOCK();
            *(int *)QVar8 = *(int *)QVar8 + -1;
            UNLOCK();
            if (*(int *)QVar8 == 0) {
              QArrayData::deallocate((QArrayData *)QVar8,1,0x10);
            }
          }
          QFile::~QFile((QFile *)&local_c8);
          QFileInfo::~QFileInfo((QFileInfo *)&local_a0);
          if (local_98 != (QJsonParseError)0x0) {
            LOCK();
            *(int *)local_98 = *(int *)local_98 + -1;
            UNLOCK();
            QVar8 = local_98;
            if (*(int *)local_98 != 0) goto LAB_0011ccc5;
            goto LAB_0011c83e;
          }
        }
LAB_0011ccc5:
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
          }
        }
        lVar7 = (this->super_Parser).index;
      } while (lVar7 < (this->super_Parser).symbols.d.size);
    }
    if (local_48 != (Data *)0x0) {
      QJsonDocument::fromJson((QByteArray *)&local_108,&local_58);
      QJsonDocument::swap(&(def->pluginData).metaData);
      QJsonDocument::~QJsonDocument((QJsonDocument *)&local_108);
      cVar6 = QJsonDocument::isObject();
      if (cVar6 == '\0') {
        local_138.a.b.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        local_138.a.a = (char (*) [22])&DAT_aaaaaaaaaaaaaaaa;
        local_138.a.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        QByteArray::mid((longlong)&local_158,
                        (longlong)
                        &(this->super_Parser).symbols.d.ptr[(this->super_Parser).index + -1].lex);
        local_108.a.a.b.d.size = (qsizetype)local_158.b.d.ptr;
        local_108.a.a.b.d.ptr = (char *)local_158.b.d.d;
        local_108.a.a.b.d.d = (Data *)local_158.a;
        local_158.b.d.ptr = (char *)0x0;
        local_108.a.a.a = (char (*) [22])0x142bab;
        local_158.a = (char (*) [22])0x0;
        local_158.b.d.d = (Data *)0x0;
        local_108.a.b = (char (*) [23])0x142c05;
        QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[67]>::
        convertTo<QByteArray>
                  ((QByteArray *)&local_138,
                   (QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[67]>
                    *)&local_108);
        if (&(local_108.a.a.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_108.a.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_108.a.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               + -1;
          UNLOCK();
          if (((local_108.a.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_108.a.a.b.d.d)->super_QArrayData,1,0x10);
          }
        }
        if ((QArrayData *)local_158.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)*local_158.a)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)*local_158.a)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)*local_158.a)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_158.a,1,0x10);
          }
        }
        pDVar13 = local_138.a.b.d.d;
        if (local_138.a.b.d.d == (Data *)0x0) {
          pDVar13 = (Data *)&QByteArray::_empty;
        }
        Parser::warning(&this->super_Parser,(char *)pDVar13);
        pQVar3 = &((def->pluginData).iid.d.d)->super_QArrayData;
        (def->pluginData).iid.d.d = (Data *)0x0;
        (def->pluginData).iid.d.ptr = (char *)0x0;
        (def->pluginData).iid.d.size = 0;
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar3,1,0x10);
          }
        }
        pQVar3 = &((def->pluginData).uri.d.d)->super_QArrayData;
        (def->pluginData).uri.d.d = (Data *)0x0;
        (def->pluginData).uri.d.ptr = (char *)0x0;
        (def->pluginData).uri.d.size = 0;
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar3,1,0x10);
          }
        }
        if ((QArrayData *)local_138.a.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)*local_138.a.a)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)*local_138.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)*local_138.a.a)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_138.a.a,1,0x10);
          }
        }
        goto LAB_0011cd7b;
      }
    }
    this->mustIncludeQPluginH = true;
    lVar7 = (this->super_Parser).index;
    if ((lVar7 < (this->super_Parser).symbols.d.size) &&
       ((this->super_Parser).symbols.d.ptr[lVar7].token == PP_RPAREN)) {
      (this->super_Parser).index = lVar7 + 1;
LAB_0011cd7b:
      if (local_58 != (QJsonParseError)0x0) {
        LOCK();
        *(int *)local_58 = *(int *)local_58 + -1;
        UNLOCK();
        if (*(int *)local_58 == 0) {
          QArrayData::deallocate((QArrayData *)local_58,1,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  }
LAB_0011cf6a:
  Parser::error(&this->super_Parser,(char *)0x0);
}

Assistant:

void Moc::parsePluginData(ClassDef *def)
{
    next(LPAREN);
    QByteArray metaData;
    while (test(IDENTIFIER)) {
        QByteArray l = lexem();
        if (l == "IID") {
            next(STRING_LITERAL);
            def->pluginData.iid = unquotedLexem();
        } else if (l == "URI") {
            next(STRING_LITERAL);
            def->pluginData.uri = unquotedLexem();
        } else if (l == "FILE") {
            next(STRING_LITERAL);
            QByteArray metaDataFile = unquotedLexem();
            QFileInfo fi(QFileInfo(QString::fromLocal8Bit(currentFilenames.top())).dir(),
                         QString::fromLocal8Bit(metaDataFile));
            for (const IncludePath &p : std::as_const(includes)) {
                if (fi.exists())
                    break;
                if (p.isFrameworkPath)
                    continue;

                fi.setFile(QString::fromLocal8Bit(p.path.constData()), QString::fromLocal8Bit(metaDataFile.constData()));
                // try again, maybe there's a file later in the include paths with the same name
                if (fi.isDir()) {
                    fi = QFileInfo();
                    continue;
                }
            }
            if (!fi.exists()) {
                const QByteArray msg = "Plugin Metadata file " + lexem()
                        + " does not exist. Declaration will be ignored";
                error(msg.constData());
                return;
            }
            QFile file(fi.canonicalFilePath());
            if (!file.open(QFile::ReadOnly)) {
                QByteArray msg = "Plugin Metadata file " + lexem() + " could not be opened: "
                    + file.errorString().toUtf8();
                error(msg.constData());
                return;
            }
            parsedPluginMetadataFiles.append(fi.canonicalFilePath());
            metaData = file.readAll();
        }
    }

    if (!metaData.isEmpty()) {
        def->pluginData.metaData = QJsonDocument::fromJson(metaData);
        if (!def->pluginData.metaData.isObject()) {
            const QByteArray msg = "Plugin Metadata file " + lexem()
                    + " does not contain a valid JSON object. Declaration will be ignored";
            warning(msg.constData());
            def->pluginData.iid = QByteArray();
            def->pluginData.uri = QByteArray();
            return;
        }
    }

    mustIncludeQPluginH = true;
    next(RPAREN);
}